

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> **objToLoad,
               int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *manager;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *this;
  XSerializeEngine *manager_00;
  KVStringPair *valueToAdopt;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  XMLSize_t itemIndex;
  ulong uVar2;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  
  manager_00 = serEng;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    XSerializeEngine::readSize(serEng,&hashModulus);
    this = *objToLoad;
    if (this == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
      manager = XSerializeEngine::getMemoryManager(serEng);
      this = (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,manager);
      manager_00 = (XSerializeEngine *)XSerializeEngine::getMemoryManager(serEng);
      RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::RefHashTableOf
                (this,hashModulus,toAdopt,(MemoryManager *)manager_00);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,this);
    itemNumber = 0;
    XSerializeEngine::readSize(serEng,&itemNumber);
    __buf = extraout_RDX;
    for (uVar2 = 0; uVar2 < itemNumber; uVar2 = uVar2 + 1) {
      valueToAdopt = (KVStringPair *)
                     XSerializeEngine::read(serEng,0x412ab0,__buf,(size_t)manager_00);
      RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::put
                (*objToLoad,valueToAdopt->fKey,valueToAdopt);
      __buf = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<KVStringPair>** objToLoad
                                   , int
                                   , bool                           toAdopt
                                   , XSerializeEngine&              serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<KVStringPair>(
                                                          hashModulus
                                                        , toAdopt
                                                        , serEng.getMemoryManager()
                                                         );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            KVStringPair*  data;
            serEng>>data;

            (*objToLoad)->put((void*)data->getKey(), data);
        }
    }
}